

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpFrom>::
destroy(AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpFrom>
        *this)

{
  WebSocketPipeImpl *pWVar1;
  
  pWVar1 = (this->adapter).pipe;
  if ((BlockedPumpFrom *)(pWVar1->state).ptr == &this->adapter) {
    (pWVar1->state).ptr = (WebSocket *)0x0;
  }
  Canceler::~Canceler(&(this->adapter).canceler);
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<void>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }